

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

ON_MeshFace ON_UnsetMeshFaceInitalizer(void)

{
  ON_MeshFace OVar1;
  ON_MeshFace unset_mesh_face;
  
  OVar1.vi[0] = -1;
  OVar1.vi[1] = -1;
  OVar1.vi[2] = 0xffffffff;
  OVar1.vi[3] = -1;
  return (ON_MeshFace)OVar1.vi;
}

Assistant:

static ON_MeshFace ON_UnsetMeshFaceInitalizer()
{
  ON_MeshFace unset_mesh_face;
  unset_mesh_face.vi[0] = -1;
  unset_mesh_face.vi[1] = -1;
  unset_mesh_face.vi[2] = -1;
  unset_mesh_face.vi[3] = -1;
  return unset_mesh_face;
}